

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::fill(void *src,void *dst,int dstride,int ures,int vres,int pixelsize)

{
  long lVar1;
  size_t sVar2;
  
  for (sVar2 = 0; (long)(ures * pixelsize) != sVar2; sVar2 = sVar2 + (long)pixelsize) {
    memcpy((void *)((long)dst + sVar2),src,(long)pixelsize);
  }
  for (lVar1 = (long)dstride; vres * dstride != lVar1; lVar1 = lVar1 + dstride) {
    memcpy((void *)((long)dst + lVar1),dst,(long)(ures * pixelsize));
  }
  return;
}

Assistant:

void fill(const void* src, void* dst, int dstride,
          int ures, int vres, int pixelsize)
{
    // fill first row
    int rowlen = ures*pixelsize;
    char* ptr = (char*) dst;
    char* end = ptr + rowlen;
    for (; ptr != end; ptr += pixelsize) memcpy(ptr, src, pixelsize);

    // fill remaining rows from first row
    ptr = (char*) dst + dstride;
    end = (char*) dst + vres*dstride;
    for (; ptr != end; ptr += dstride) memcpy(ptr, dst, rowlen);
}